

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_alps_add_clienthello_impl
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type,
               bool use_new_codepoint)

{
  SSL *pSVar1;
  bool bVar2;
  int iVar3;
  Vector<bssl::ALPSConfig> *this;
  ALPSConfig *pAVar4;
  uchar *data;
  size_t len;
  ALPSConfig *config;
  ALPSConfig *__end1;
  ALPSConfig *__begin1;
  Vector<bssl::ALPSConfig> *__range1;
  CBB proto;
  CBB proto_list;
  CBB contents;
  uint16_t extension_type;
  SSL *ssl;
  bool use_new_codepoint_local;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  pSVar1 = hs->ssl;
  if ((((hs->max_version < 0x304) ||
       (bVar2 = Array<unsigned_char>::empty(&hs->config->alpn_client_proto_list), bVar2)) ||
      (bVar2 = Vector<bssl::ALPSConfig>::empty(&hs->config->alps_configs), bVar2)) ||
     ((*(ushort *)&pSVar1->s3->field_0xdc >> 4 & 1) != 0)) {
    return true;
  }
  if (use_new_codepoint !=
      (bool)((byte)((ushort)*(undefined2 *)&hs->config->field_0x10d >> 0xd) & 1)) {
    return true;
  }
  contents.u._30_2_ = 0x4469;
  if ((*(ushort *)&hs->config->field_0x10d >> 0xd & 1) != 0) {
    contents.u._30_2_ = 0x44cd;
  }
  iVar3 = CBB_add_u16(out_compressible,contents.u._30_2_);
  if (((iVar3 != 0) &&
      (iVar3 = CBB_add_u16_length_prefixed(out_compressible,(CBB *)((long)&proto_list.u + 0x18)),
      iVar3 != 0)) &&
     (iVar3 = CBB_add_u16_length_prefixed
                        ((CBB *)((long)&proto_list.u + 0x18),(CBB *)((long)&proto.u + 0x18)),
     iVar3 != 0)) {
    this = &hs->config->alps_configs;
    __end1 = Vector<bssl::ALPSConfig>::begin(this);
    pAVar4 = Vector<bssl::ALPSConfig>::end(this);
    while( true ) {
      if (__end1 == pAVar4) {
        iVar3 = CBB_flush(out_compressible);
        return iVar3 != 0;
      }
      iVar3 = CBB_add_u8_length_prefixed((CBB *)((long)&proto.u + 0x18),(CBB *)&__range1);
      if (iVar3 == 0) break;
      data = Array<unsigned_char>::data(&__end1->protocol);
      len = Array<unsigned_char>::size(&__end1->protocol);
      iVar3 = CBB_add_bytes((CBB *)&__range1,data,len);
      if (iVar3 == 0) {
        return false;
      }
      __end1 = __end1 + 1;
    }
    return false;
  }
  return false;
}

Assistant:

static bool ext_alps_add_clienthello_impl(const SSL_HANDSHAKE *hs, CBB *out,
                                          CBB *out_compressible,
                                          ssl_client_hello_type_t type,
                                          bool use_new_codepoint) {
  const SSL *const ssl = hs->ssl;
  if (  // ALPS requires TLS 1.3.
      hs->max_version < TLS1_3_VERSION ||
      // Do not offer ALPS without ALPN.
      hs->config->alpn_client_proto_list.empty() ||
      // Do not offer ALPS if not configured.
      hs->config->alps_configs.empty() ||
      // Do not offer ALPS on renegotiation handshakes.
      ssl->s3->initial_handshake_complete) {
    return true;
  }

  if (use_new_codepoint != hs->config->alps_use_new_codepoint) {
    // Do nothing, we'll send the other codepoint.
    return true;
  }

  uint16_t extension_type = TLSEXT_TYPE_application_settings_old;
  if (hs->config->alps_use_new_codepoint) {
    extension_type = TLSEXT_TYPE_application_settings;
  }

  CBB contents, proto_list, proto;
  if (!CBB_add_u16(out_compressible, extension_type) ||
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &proto_list)) {
    return false;
  }

  for (const ALPSConfig &config : hs->config->alps_configs) {
    if (!CBB_add_u8_length_prefixed(&proto_list, &proto) ||
        !CBB_add_bytes(&proto, config.protocol.data(),
                       config.protocol.size())) {
      return false;
    }
  }

  return CBB_flush(out_compressible);
}